

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

rrb<char,_false,_6> *
immutable::rrb_details::rrb_tail_push<char,false,6>
          (ref<immutable::rrb<char,_false,_6>_> *in,char element)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  uint uVar3;
  rrb<char,_false,_6> *prVar4;
  tree_node<char,_false> *ptVar5;
  leaf_node<char,_false> *plVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  undefined4 uVar9;
  rrb<char,_false,_6> *prVar10;
  ulong uVar11;
  ulong uVar12;
  leaf_node<char,_false> *plVar13;
  ref<immutable::rrb_details::leaf_node<char,_false>_> local_38;
  
  prVar4 = in->ptr;
  prVar10 = (rrb<char,_false,_6> *)malloc(0x28);
  uVar2 = prVar4->cnt;
  uVar7 = prVar4->shift;
  uVar8 = prVar4->tail_len;
  uVar9 = *(undefined4 *)&prVar4->field_0xc;
  ptVar5 = (prVar4->root).ptr;
  (prVar10->tail).ptr = (prVar4->tail).ptr;
  (prVar10->root).ptr = ptVar5;
  prVar10->cnt = uVar2;
  prVar10->shift = uVar7;
  prVar10->tail_len = uVar8;
  *(undefined4 *)&prVar10->field_0xc = uVar9;
  uVar9 = *(undefined4 *)&prVar4->field_0x24;
  prVar10->_ref_count = prVar4->_ref_count;
  *(undefined4 *)&prVar10->field_0x24 = uVar9;
  ptVar5 = (prVar10->root).ptr;
  if (ptVar5 != (tree_node<char,_false> *)0x0) {
    puVar1 = &ptVar5->_ref_count;
    *puVar1 = *puVar1 + 1;
  }
  plVar13 = (prVar10->tail).ptr;
  if (plVar13 != (leaf_node<char,_false> *)0x0) {
    puVar1 = &plVar13->_ref_count;
    *puVar1 = *puVar1 + 1;
  }
  plVar6 = (prVar4->tail).ptr;
  uVar2 = plVar6->len;
  uVar3 = uVar2 + 1;
  local_38.ptr = (leaf_node<char,_false> *)calloc(1,(ulong)uVar3 + 0x18);
  (local_38.ptr)->len = uVar3;
  plVar13 = local_38.ptr + 1;
  (local_38.ptr)->child = (char *)plVar13;
  if (uVar2 == 0) {
    uVar11 = 0;
  }
  else {
    uVar12 = 0;
    do {
      (local_38.ptr)->child[uVar12] = plVar6->child[uVar12];
      uVar12 = uVar12 + 1;
      uVar11 = (ulong)plVar6->len;
    } while (uVar12 < uVar11);
    plVar13 = (leaf_node<char,_false> *)(local_38.ptr)->child;
  }
  *(undefined1 *)((long)&plVar13->type + uVar11) = 0;
  uVar3 = prVar10->tail_len;
  (local_38.ptr)->child[uVar3] = element;
  prVar10->cnt = prVar10->cnt + 1;
  prVar10->tail_len = uVar3 + 1;
  (local_38.ptr)->_ref_count = 1;
  ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=(&prVar10->tail,&local_38);
  if ((local_38.ptr != (leaf_node<char,_false> *)0x0) &&
     (uVar2 = (local_38.ptr)->_ref_count, (local_38.ptr)->_ref_count = uVar2 - 1, uVar2 == 1)) {
    free(local_38.ptr);
  }
  return prVar10;
}

Assistant:

inline rrb<T, atomic_ref_counting, N>* rrb_tail_push(const ref<rrb<T, atomic_ref_counting, N>>& in, T element)
      {
      rrb<T, atomic_ref_counting, N>* new_rrb = rrb_head_clone(in.ptr);
      leaf_node<T, atomic_ref_counting>* new_tail = leaf_node_inc(in->tail.ptr);
      new_tail->child[new_rrb->tail_len] = std::move(element);
      new_rrb->cnt++;
      new_rrb->tail_len++;
      new_rrb->tail = new_tail;
      return new_rrb;
      }